

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O1

BOOL TLSInitialize(void)

{
  int iVar1;
  BOOL BVar2;
  
  BVar2 = 0;
  CCLock::Reset(&free_threads_spinlock,false);
  iVar1 = pthread_key_create(&CorUnix::thObjKey,InternalEndCurrentThreadWrapper);
  if (iVar1 == 0) {
    BVar2 = 1;
  }
  else if (PAL_InitializeChakraCoreCalled == false) {
    abort();
  }
  return BVar2;
}

Assistant:

BOOL TLSInitialize()
{
    // This will be called once and can't be called during/after another lock
     // in place due to PAL is not yet initialized. The underlying issue here is
     // related to whole lib/pal initialization on start.
     free_threads_spinlock.Reset();

    /* Create the pthread key for thread objects, which we use
       for fast access to the current thread object. */
    if (pthread_key_create(&thObjKey, InternalEndCurrentThreadWrapper))
    {
        ERROR("Couldn't create the thread object key\n");
        return FALSE;
    }

    return TRUE;
}